

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::LoopWorkloadReferenceCase::writeWorkload
          (LoopWorkloadReferenceCase *this,ostringstream *dst,char *resultVariableName,
          char *inputVariableName)

{
  PerfCaseType PVar1;
  size_t sVar2;
  int iVar3;
  
  PVar1 = (this->super_WorkloadReferenceCase).super_ControlStatementCase.super_ShaderPerformanceCase
          .m_caseType;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"\t",1);
  if (resultVariableName == (char *)0x0) {
    std::ios::clear((int)dst + (int)*(undefined8 *)(*(long *)dst + -0x18));
  }
  else {
    sVar2 = strlen(resultVariableName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,resultVariableName,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst," = vec4(0.0);\n",0xe);
  iVar3 = 0xb;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"\t",1);
    writeLoopWorkload(dst,resultVariableName,inputVariableName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dst,"\n",1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if ((PVar1 != CASETYPE_VERTEX) && (this->m_isAttributeStable == false)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)dst,"\tres.x = fract(res.x);\n",0x17);
    return;
  }
  return;
}

Assistant:

void LoopWorkloadReferenceCase::writeWorkload (std::ostringstream& dst, const char* resultVariableName, const char* inputVariableName) const
{
	const int	loopIterations	= 11;
	bool		isVertexCase	= m_caseType == CASETYPE_VERTEX;

	dst << "\t" << resultVariableName << " = vec4(0.0);\n";

	for (int i = 0; i < loopIterations; i++)
	{
		dst << "\t";
		writeLoopWorkload(dst, resultVariableName, inputVariableName);
		dst << "\n";
	}

	if (!isVertexCase && !m_isAttributeStable)
	{
		// Corresponds to the fract() done in a real test's fragment case with non-stable attribute.
		dst << "	res.x = fract(res.x);\n";
	}
}